

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,ConstStringParam value,Arena *arena)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  string *psVar2;
  ulong uVar3;
  Arena *arena_local;
  ConstStringParam value_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  bVar1 = IsDefault(this,default_value);
  if (bVar1) {
    p = Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>(arena,value);
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (&this->tagged_ptr_,p);
  }
  else {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
    uVar3 = std::__cxx11::string::data();
    std::__cxx11::string::length();
    std::__cxx11::string::assign((char *)psVar2,uVar3);
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value,
                         ConstStringParam value, ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    tagged_ptr_.Set(Arena::Create<std::string>(arena, value));
  } else {
    UnsafeMutablePointer()->assign(value.data(), value.length());
  }
}